

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexBuildNetworkTest(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  abctime aVar1;
  Gia_Man_t *p_00;
  abctime aVar2;
  abctime clk;
  Gia_Man_t *pNew;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  p_00 = Bmc_CexBuildNetwork(p,pCex);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  Gia_AigerWrite(p_00,"unate.aig",0,0,0);
  Gia_ManStop(p_00);
  printf("CE-induced network is written into file \"unate.aig\".\n");
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  return;
}

Assistant:

void Bmc_CexBuildNetworkTest( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    pNew = Bmc_CexBuildNetwork( p, pCex );
    Gia_ManPrintStats( pNew, NULL );
    Gia_AigerWrite( pNew, "unate.aig", 0, 0, 0 );
//Bmc_CexDumpAogStats( pNew, Abc_Clock() - clk );
    Gia_ManStop( pNew );
    printf( "CE-induced network is written into file \"unate.aig\".\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}